

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O2

bool caffe::UpgradeV0LayerParameter
               (V1LayerParameter *v0_layer_connection,V1LayerParameter *layer_param)

{
  uint32 uVar1;
  string *type;
  bool bVar2;
  uint uVar3;
  V1LayerParameter_LayerType value;
  Type *pTVar4;
  BlobProto *this;
  Type *from;
  ConvolutionParameter *pCVar5;
  FillerParameter *pFVar6;
  InnerProductParameter *pIVar7;
  PoolingParameter *pPVar8;
  DropoutParameter *pDVar9;
  LRNParameter *pLVar10;
  DataParameter *pDVar11;
  InfogainLossParameter *this_00;
  TransformationParameter *pTVar12;
  HDF5DataParameter *pHVar13;
  ImageDataParameter *pIVar14;
  ConcatParameter *pCVar15;
  WindowDataParameter *pWVar16;
  HDF5OutputParameter *this_01;
  ostream *poVar17;
  bool bVar18;
  int i;
  int iVar19;
  PoolingParameter_PoolMethod value_00;
  FillerParameter *pFVar20;
  HDF5OutputParameter *from_00;
  V0LayerParameter *this_02;
  float fVar21;
  
  V1LayerParameter::Clear(layer_param);
  for (iVar19 = 0; iVar19 < (v0_layer_connection->bottom_).super_RepeatedPtrFieldBase.current_size_;
      iVar19 = iVar19 + 1) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(v0_layer_connection->bottom_).super_RepeatedPtrFieldBase,iVar19);
    V1LayerParameter::add_bottom(layer_param,pTVar4);
  }
  for (iVar19 = 0; iVar19 < (v0_layer_connection->top_).super_RepeatedPtrFieldBase.current_size_;
      iVar19 = iVar19 + 1) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(v0_layer_connection->top_).super_RepeatedPtrFieldBase,iVar19);
    V1LayerParameter::add_top(layer_param,pTVar4);
  }
  if (((v0_layer_connection->_has_bits_).has_bits_[0] & 2) == 0) {
    return true;
  }
  this_02 = v0_layer_connection->layer_;
  if (this_02 == (V0LayerParameter *)0x0) {
    this_02 = (V0LayerParameter *)&_V0LayerParameter_default_instance_;
  }
  uVar3 = (this_02->_has_bits_).has_bits_[0];
  if ((uVar3 & 1) != 0) {
    V1LayerParameter::set_name(layer_param,(this_02->name_).ptr_);
    uVar3 = (this_02->_has_bits_).has_bits_[0];
  }
  type = (this_02->type_).ptr_;
  if ((uVar3 & 2) != 0) {
    value = UpgradeV0LayerType(type);
    V1LayerParameter::set_type(layer_param,value);
  }
  for (iVar19 = 0; iVar19 < (this_02->blobs_).super_RepeatedPtrFieldBase.current_size_;
      iVar19 = iVar19 + 1) {
    this = google::protobuf::RepeatedPtrField<caffe::BlobProto>::Add(&layer_param->blobs_);
    from = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                     (&(this_02->blobs_).super_RepeatedPtrFieldBase,iVar19);
    BlobProto::CopyFrom(this,from);
  }
  for (iVar19 = 0; iVar19 < (this_02->blobs_lr_).current_size_; iVar19 = iVar19 + 1) {
    fVar21 = V0LayerParameter::blobs_lr(this_02,iVar19);
    V1LayerParameter::add_blobs_lr(layer_param,fVar21);
  }
  for (iVar19 = 0; iVar19 < (this_02->weight_decay_).current_size_; iVar19 = iVar19 + 1) {
    fVar21 = V0LayerParameter::weight_decay(this_02,iVar19);
    V1LayerParameter::add_weight_decay(layer_param,fVar21);
  }
  bVar18 = true;
  if (((this_02->_has_bits_).has_bits_[0] & 0x100) != 0) {
    bVar2 = std::operator==(type,"conv");
    if (bVar2) {
      pCVar5 = V1LayerParameter::mutable_convolution_param(layer_param);
      uVar1 = this_02->num_output_;
      (pCVar5->_has_bits_).has_bits_[0] = (pCVar5->_has_bits_).has_bits_[0] | 4;
      pCVar5->num_output_ = uVar1;
    }
    else {
      bVar2 = std::operator==(type,"innerproduct");
      if (bVar2) {
        pIVar7 = V1LayerParameter::mutable_inner_product_param(layer_param);
        uVar1 = this_02->num_output_;
        (pIVar7->_has_bits_).has_bits_[0] = (pIVar7->_has_bits_).has_bits_[0] | 4;
        pIVar7->num_output_ = uVar1;
      }
      else {
        poVar17 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter num_output for layer type ");
        std::operator<<(poVar17,(string *)type);
        bVar18 = false;
      }
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x800000) != 0) {
    bVar2 = std::operator==(type,"conv");
    if (bVar2) {
      pCVar5 = V1LayerParameter::mutable_convolution_param(layer_param);
      bVar2 = this_02->biasterm_;
      (pCVar5->_has_bits_).has_bits_[0] = (pCVar5->_has_bits_).has_bits_[0] | 0x1000;
      pCVar5->bias_term_ = bVar2;
    }
    else {
      bVar2 = std::operator==(type,"innerproduct");
      if (bVar2) {
        pIVar7 = V1LayerParameter::mutable_inner_product_param(layer_param);
        bVar2 = this_02->biasterm_;
        (pIVar7->_has_bits_).has_bits_[0] = (pIVar7->_has_bits_).has_bits_[0] | 0x10;
        pIVar7->bias_term_ = bVar2;
      }
      else {
        poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter biasterm for layer type "
                                 );
        std::operator<<(poVar17,(string *)type);
        bVar18 = false;
      }
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x20) != 0) {
    bVar2 = std::operator==(type,"conv");
    if (bVar2) {
      pCVar5 = V1LayerParameter::mutable_convolution_param(layer_param);
      pFVar6 = ConvolutionParameter::mutable_weight_filler(pCVar5);
    }
    else {
      bVar2 = std::operator==(type,"innerproduct");
      if (!bVar2) {
        poVar17 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter weight_filler for layer type ");
        std::operator<<(poVar17,(string *)type);
        bVar18 = false;
        goto LAB_004be99d;
      }
      pIVar7 = V1LayerParameter::mutable_inner_product_param(layer_param);
      pFVar6 = InnerProductParameter::mutable_weight_filler(pIVar7);
    }
    pFVar20 = this_02->weight_filler_;
    if (pFVar20 == (FillerParameter *)0x0) {
      pFVar20 = (FillerParameter *)&_FillerParameter_default_instance_;
    }
    FillerParameter::CopyFrom(pFVar6,pFVar20);
  }
LAB_004be99d:
  if (((this_02->_has_bits_).has_bits_[0] & 0x40) != 0) {
    bVar2 = std::operator==(type,"conv");
    if (bVar2) {
      pCVar5 = V1LayerParameter::mutable_convolution_param(layer_param);
      pFVar6 = ConvolutionParameter::mutable_bias_filler(pCVar5);
    }
    else {
      bVar2 = std::operator==(type,"innerproduct");
      if (!bVar2) {
        poVar17 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter bias_filler for layer type ");
        std::operator<<(poVar17,(string *)type);
        bVar18 = false;
        goto LAB_004bea2d;
      }
      pIVar7 = V1LayerParameter::mutable_inner_product_param(layer_param);
      pFVar6 = InnerProductParameter::mutable_bias_filler(pIVar7);
    }
    pFVar20 = this_02->bias_filler_;
    if (pFVar20 == (FillerParameter *)0x0) {
      pFVar20 = (FillerParameter *)&_FillerParameter_default_instance_;
    }
    FillerParameter::CopyFrom(pFVar6,pFVar20);
  }
LAB_004bea2d:
  if (((this_02->_has_bits_).has_bits_[0] & 0x200) != 0) {
    bVar2 = std::operator==(type,"conv");
    if (bVar2) {
      pCVar5 = V1LayerParameter::mutable_convolution_param(layer_param);
      ConvolutionParameter::add_pad(pCVar5,this_02->pad_);
    }
    else {
      bVar2 = std::operator==(type,"pool");
      if (bVar2) {
        pPVar8 = V1LayerParameter::mutable_pooling_param(layer_param);
        uVar1 = this_02->pad_;
        (pPVar8->_has_bits_).has_bits_[0] = (pPVar8->_has_bits_).has_bits_[0] | 4;
        pPVar8->pad_ = uVar1;
      }
      else {
        poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter pad for layer type ");
        std::operator<<(poVar17,(string *)type);
        bVar18 = false;
      }
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x400) != 0) {
    bVar2 = std::operator==(type,"conv");
    if (bVar2) {
      pCVar5 = V1LayerParameter::mutable_convolution_param(layer_param);
      ConvolutionParameter::add_kernel_size(pCVar5,this_02->kernelsize_);
    }
    else {
      bVar2 = std::operator==(type,"pool");
      if (bVar2) {
        pPVar8 = V1LayerParameter::mutable_pooling_param(layer_param);
        uVar1 = this_02->kernelsize_;
        (pPVar8->_has_bits_).has_bits_[0] = (pPVar8->_has_bits_).has_bits_[0] | 2;
        pPVar8->kernel_size_ = uVar1;
      }
      else {
        poVar17 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter kernelsize for layer type ");
        std::operator<<(poVar17,(string *)type);
        bVar18 = false;
      }
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x1000000) != 0) {
    bVar2 = std::operator==(type,"conv");
    if (bVar2) {
      pCVar5 = V1LayerParameter::mutable_convolution_param(layer_param);
      uVar1 = this_02->group_;
      (pCVar5->_has_bits_).has_bits_[0] = (pCVar5->_has_bits_).has_bits_[0] | 0x2000;
      pCVar5->group_ = uVar1;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter group for layer type ");
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x2000000) != 0) {
    bVar2 = std::operator==(type,"conv");
    if (bVar2) {
      pCVar5 = V1LayerParameter::mutable_convolution_param(layer_param);
      ConvolutionParameter::add_stride(pCVar5,this_02->stride_);
    }
    else {
      bVar2 = std::operator==(type,"pool");
      if (bVar2) {
        pPVar8 = V1LayerParameter::mutable_pooling_param(layer_param);
        uVar1 = this_02->stride_;
        (pPVar8->_has_bits_).has_bits_[0] = (pPVar8->_has_bits_).has_bits_[0] | 0x800;
        pPVar8->stride_ = uVar1;
      }
      else {
        poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter stride for layer type ");
        std::operator<<(poVar17,(string *)type);
        bVar18 = false;
      }
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x800) == 0) goto LAB_004bec88;
  bVar2 = std::operator==(type,"pool");
  if (bVar2) {
    iVar19 = this_02->pool_;
    if (iVar19 == 2) {
      pPVar8 = V1LayerParameter::mutable_pooling_param(layer_param);
      value_00 = PoolingParameter_PoolMethod_STOCHASTIC;
    }
    else if (iVar19 == 1) {
      pPVar8 = V1LayerParameter::mutable_pooling_param(layer_param);
      value_00 = PoolingParameter_PoolMethod_AVE;
    }
    else {
      if (iVar19 != 0) {
        poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown pool method ");
        std::ostream::operator<<((ostream *)poVar17,iVar19);
        goto LAB_004bec65;
      }
      pPVar8 = V1LayerParameter::mutable_pooling_param(layer_param);
      value_00 = PoolingParameter_PoolMethod_MAX;
    }
    PoolingParameter::set_pool(pPVar8,value_00);
  }
  else {
    poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter pool for layer type ");
    std::operator<<(poVar17,(string *)type);
LAB_004bec65:
    bVar18 = false;
  }
LAB_004bec88:
  if (((this_02->_has_bits_).has_bits_[0] & 0x4000000) != 0) {
    bVar2 = std::operator==(type,"dropout");
    if (bVar2) {
      pDVar9 = V1LayerParameter::mutable_dropout_param(layer_param);
      fVar21 = this_02->dropout_ratio_;
      (pDVar9->_has_bits_).has_bits_[0] = (pDVar9->_has_bits_).has_bits_[0] | 1;
      pDVar9->dropout_ratio_ = fVar21;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,
                                "Unknown parameter dropout_ratio for layer type ");
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x8000000) != 0) {
    bVar2 = std::operator==(type,"lrn");
    if (bVar2) {
      pLVar10 = V1LayerParameter::mutable_lrn_param(layer_param);
      uVar1 = this_02->local_size_;
      (pLVar10->_has_bits_).has_bits_[0] = (pLVar10->_has_bits_).has_bits_[0] | 4;
      pLVar10->local_size_ = uVar1;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter local_size for layer type "
                               );
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x10000000) != 0) {
    bVar2 = std::operator==(type,"lrn");
    if (bVar2) {
      pLVar10 = V1LayerParameter::mutable_lrn_param(layer_param);
      fVar21 = this_02->alpha_;
      (pLVar10->_has_bits_).has_bits_[0] = (pLVar10->_has_bits_).has_bits_[0] | 8;
      pLVar10->alpha_ = fVar21;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter alpha for layer type ");
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  uVar3 = (this_02->_has_bits_).has_bits_[0];
  if ((uVar3 >> 0x1d & 1) != 0) {
    bVar2 = std::operator==(type,"lrn");
    if (bVar2) {
      pLVar10 = V1LayerParameter::mutable_lrn_param(layer_param);
      fVar21 = this_02->beta_;
      (pLVar10->_has_bits_).has_bits_[0] = (pLVar10->_has_bits_).has_bits_[0] | 0x10;
      pLVar10->beta_ = fVar21;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter beta for layer type ");
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
    uVar3 = (this_02->_has_bits_).has_bits_[0];
  }
  if ((int)uVar3 < 0) {
    bVar2 = std::operator==(type,"lrn");
    if (bVar2) {
      pLVar10 = V1LayerParameter::mutable_lrn_param(layer_param);
      fVar21 = this_02->k_;
      (pLVar10->_has_bits_).has_bits_[0] = (pLVar10->_has_bits_).has_bits_[0] | 0x20;
      pLVar10->k_ = fVar21;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter k for layer type ");
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 4) != 0) {
    bVar2 = std::operator==(type,"data");
    if (bVar2) {
      pDVar11 = V1LayerParameter::mutable_data_param(layer_param);
      DataParameter::set_source(pDVar11,(this_02->source_).ptr_);
    }
    else {
      bVar2 = std::operator==(type,"hdf5_data");
      if (bVar2) {
        pHVar13 = V1LayerParameter::mutable_hdf5_data_param(layer_param);
        HDF5DataParameter::set_source(pHVar13,(this_02->source_).ptr_);
      }
      else {
        bVar2 = std::operator==(type,"images");
        if (bVar2) {
          pIVar14 = V1LayerParameter::mutable_image_data_param(layer_param);
          ImageDataParameter::set_source(pIVar14,(this_02->source_).ptr_);
        }
        else {
          bVar2 = std::operator==(type,"window_data");
          if (bVar2) {
            pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
            WindowDataParameter::set_source(pWVar16,(this_02->source_).ptr_);
          }
          else {
            bVar2 = std::operator==(type,"infogain_loss");
            if (bVar2) {
              this_00 = V1LayerParameter::mutable_infogain_loss_param(layer_param);
              InfogainLossParameter::set_source(this_00,(this_02->source_).ptr_);
            }
            else {
              poVar17 = std::operator<<((ostream *)&std::cerr,
                                        "Unknown parameter source for layer type ");
              std::operator<<(poVar17,(string *)type);
              bVar18 = false;
            }
          }
        }
      }
    }
  }
  uVar3 = (this_02->_has_bits_).has_bits_[0];
  if ((uVar3 >> 0x1e & 1) != 0) {
    pTVar12 = V1LayerParameter::mutable_transform_param(layer_param);
    fVar21 = this_02->scale_;
    (pTVar12->_has_bits_).has_bits_[0] = (pTVar12->_has_bits_).has_bits_[0] | 0x20;
    pTVar12->scale_ = fVar21;
    uVar3 = (this_02->_has_bits_).has_bits_[0];
  }
  if ((uVar3 & 8) != 0) {
    pTVar12 = V1LayerParameter::mutable_transform_param(layer_param);
    TransformationParameter::set_mean_file(pTVar12,(this_02->meanfile_).ptr_);
    uVar3 = (this_02->_has_bits_).has_bits_[0];
  }
  if ((uVar3 >> 0xc & 1) != 0) {
    bVar2 = std::operator==(type,"data");
    if (bVar2) {
      pDVar11 = V1LayerParameter::mutable_data_param(layer_param);
      uVar1 = this_02->batchsize_;
      (pDVar11->_has_bits_).has_bits_[0] = (pDVar11->_has_bits_).has_bits_[0] | 4;
      pDVar11->batch_size_ = uVar1;
    }
    else {
      bVar2 = std::operator==(type,"hdf5_data");
      if (bVar2) {
        pHVar13 = V1LayerParameter::mutable_hdf5_data_param(layer_param);
        uVar1 = this_02->batchsize_;
        (pHVar13->_has_bits_).has_bits_[0] = (pHVar13->_has_bits_).has_bits_[0] | 2;
        pHVar13->batch_size_ = uVar1;
      }
      else {
        bVar2 = std::operator==(type,"images");
        if (bVar2) {
          pIVar14 = V1LayerParameter::mutable_image_data_param(layer_param);
          uVar1 = this_02->batchsize_;
          (pIVar14->_has_bits_).has_bits_[0] = (pIVar14->_has_bits_).has_bits_[0] | 0x800;
          pIVar14->batch_size_ = uVar1;
        }
        else {
          bVar2 = std::operator==(type,"window_data");
          if (bVar2) {
            pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
            uVar1 = this_02->batchsize_;
            (pWVar16->_has_bits_).has_bits_[0] = (pWVar16->_has_bits_).has_bits_[0] | 0x10;
            pWVar16->batch_size_ = uVar1;
          }
          else {
            poVar17 = std::operator<<((ostream *)&std::cerr,
                                      "Unknown parameter batchsize for layer type ");
            std::operator<<(poVar17,(string *)type);
            bVar18 = false;
          }
        }
      }
    }
  }
  uVar3 = (this_02->_has_bits_).has_bits_[0];
  if ((uVar3 >> 0xd & 1) != 0) {
    pTVar12 = V1LayerParameter::mutable_transform_param(layer_param);
    uVar1 = this_02->cropsize_;
    (pTVar12->_has_bits_).has_bits_[0] = (pTVar12->_has_bits_).has_bits_[0] | 2;
    pTVar12->crop_size_ = uVar1;
    uVar3 = (this_02->_has_bits_).has_bits_[0];
  }
  if ((short)uVar3 < 0) {
    pTVar12 = V1LayerParameter::mutable_transform_param(layer_param);
    bVar2 = this_02->mirror_;
    (pTVar12->_has_bits_).has_bits_[0] = (pTVar12->_has_bits_).has_bits_[0] | 4;
    pTVar12->mirror_ = bVar2;
    uVar3 = (this_02->_has_bits_).has_bits_[0];
  }
  if ((uVar3 >> 0x11 & 1) != 0) {
    bVar2 = std::operator==(type,"data");
    if (bVar2) {
      pDVar11 = V1LayerParameter::mutable_data_param(layer_param);
      uVar1 = this_02->rand_skip_;
      (pDVar11->_has_bits_).has_bits_[0] = (pDVar11->_has_bits_).has_bits_[0] | 0x10;
      pDVar11->rand_skip_ = uVar1;
    }
    else {
      bVar2 = std::operator==(type,"images");
      if (bVar2) {
        pIVar14 = V1LayerParameter::mutable_image_data_param(layer_param);
        uVar1 = this_02->rand_skip_;
        (pIVar14->_has_bits_).has_bits_[0] = (pIVar14->_has_bits_).has_bits_[0] | 0x10;
        pIVar14->rand_skip_ = uVar1;
      }
      else {
        poVar17 = std::operator<<((ostream *)&std::cerr,
                                  "Unknown parameter rand_skip for layer type ");
        std::operator<<(poVar17,(string *)type);
        bVar18 = false;
      }
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x10000) != 0) {
    bVar2 = std::operator==(type,"images");
    if (bVar2) {
      pIVar14 = V1LayerParameter::mutable_image_data_param(layer_param);
      bVar2 = this_02->shuffle_images_;
      (pIVar14->_has_bits_).has_bits_[0] = (pIVar14->_has_bits_).has_bits_[0] | 0x20;
      pIVar14->shuffle_ = bVar2;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter shuffle for layer type ");
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x200000) != 0) {
    bVar2 = std::operator==(type,"images");
    if (bVar2) {
      pIVar14 = V1LayerParameter::mutable_image_data_param(layer_param);
      uVar1 = this_02->new_height_;
      (pIVar14->_has_bits_).has_bits_[0] = (pIVar14->_has_bits_).has_bits_[0] | 0x80;
      pIVar14->new_height_ = uVar1;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter new_height for layer type "
                               );
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x4000) != 0) {
    bVar2 = std::operator==(type,"images");
    if (bVar2) {
      pIVar14 = V1LayerParameter::mutable_image_data_param(layer_param);
      uVar1 = this_02->new_width_;
      (pIVar14->_has_bits_).has_bits_[0] = (pIVar14->_has_bits_).has_bits_[0] | 0x100;
      pIVar14->new_width_ = uVar1;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter new_width for layer type ")
      ;
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x400000) != 0) {
    bVar2 = std::operator==(type,"concat");
    if (bVar2) {
      pCVar15 = V1LayerParameter::mutable_concat_param(layer_param);
      uVar1 = this_02->concat_dim_;
      (pCVar15->_has_bits_).has_bits_[0] = (pCVar15->_has_bits_).has_bits_[0] | 1;
      pCVar15->concat_dim_ = uVar1;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,"Unknown parameter concat_dim for layer type "
                               );
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[1] & 1) != 0) {
    bVar2 = std::operator==(type,"window_data");
    if (bVar2) {
      pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
      fVar21 = this_02->det_fg_threshold_;
      (pWVar16->_has_bits_).has_bits_[0] = (pWVar16->_has_bits_).has_bits_[0] | 0x400;
      pWVar16->fg_threshold_ = fVar21;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,
                                "Unknown parameter det_fg_threshold for layer type ");
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[1] & 2) != 0) {
    bVar2 = std::operator==(type,"window_data");
    if (bVar2) {
      pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
      fVar21 = this_02->det_bg_threshold_;
      (pWVar16->_has_bits_).has_bits_[0] = (pWVar16->_has_bits_).has_bits_[0] | 0x800;
      pWVar16->bg_threshold_ = fVar21;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,
                                "Unknown parameter det_bg_threshold for layer type ");
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[1] & 4) != 0) {
    bVar2 = std::operator==(type,"window_data");
    if (bVar2) {
      pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
      fVar21 = this_02->det_fg_fraction_;
      (pWVar16->_has_bits_).has_bits_[0] = (pWVar16->_has_bits_).has_bits_[0] | 0x1000;
      pWVar16->fg_fraction_ = fVar21;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,
                                "Unknown parameter det_fg_fraction for layer type ");
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x40000) != 0) {
    bVar2 = std::operator==(type,"window_data");
    if (bVar2) {
      pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
      uVar1 = this_02->det_context_pad_;
      (pWVar16->_has_bits_).has_bits_[0] = (pWVar16->_has_bits_).has_bits_[0] | 0x100;
      pWVar16->context_pad_ = uVar1;
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,
                                "Unknown parameter det_context_pad for layer type ");
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x10) != 0) {
    bVar2 = std::operator==(type,"window_data");
    if (bVar2) {
      pWVar16 = V1LayerParameter::mutable_window_data_param(layer_param);
      WindowDataParameter::set_crop_mode(pWVar16,(this_02->det_crop_mode_).ptr_);
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,
                                "Unknown parameter det_crop_mode for layer type ");
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  if (((this_02->_has_bits_).has_bits_[0] & 0x80) != 0) {
    bVar2 = std::operator==(type,"hdf5_output");
    if (bVar2) {
      this_01 = V1LayerParameter::mutable_hdf5_output_param(layer_param);
      from_00 = this_02->hdf5_output_param_;
      if (from_00 == (HDF5OutputParameter *)0x0) {
        from_00 = (HDF5OutputParameter *)&_HDF5OutputParameter_default_instance_;
      }
      HDF5OutputParameter::CopyFrom(this_01,from_00);
    }
    else {
      poVar17 = std::operator<<((ostream *)&std::cerr,
                                "Unknown parameter hdf5_output_param for layer type ");
      std::operator<<(poVar17,(string *)type);
      bVar18 = false;
    }
  }
  return bVar18;
}

Assistant:

bool UpgradeV0LayerParameter(const V1LayerParameter& v0_layer_connection,
                             V1LayerParameter* layer_param) {
  bool is_fully_compatible = true;
  layer_param->Clear();
  for (int i = 0; i < v0_layer_connection.bottom_size(); ++i) {
    layer_param->add_bottom(v0_layer_connection.bottom(i));
  }
  for (int i = 0; i < v0_layer_connection.top_size(); ++i) {
    layer_param->add_top(v0_layer_connection.top(i));
  }
  if (v0_layer_connection.has_layer()) {
    const V0LayerParameter& v0_layer_param = v0_layer_connection.layer();
    if (v0_layer_param.has_name()) {
      layer_param->set_name(v0_layer_param.name());
    }
    const string& type = v0_layer_param.type();
    if (v0_layer_param.has_type()) {
      layer_param->set_type(UpgradeV0LayerType(type));
    }
    for (int i = 0; i < v0_layer_param.blobs_size(); ++i) {
      layer_param->add_blobs()->CopyFrom(v0_layer_param.blobs(i));
    }
    for (int i = 0; i < v0_layer_param.blobs_lr_size(); ++i) {
      layer_param->add_blobs_lr(v0_layer_param.blobs_lr(i));
    }
    for (int i = 0; i < v0_layer_param.weight_decay_size(); ++i) {
      layer_param->add_weight_decay(v0_layer_param.weight_decay(i));
    }
    if (v0_layer_param.has_num_output()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->set_num_output(
            v0_layer_param.num_output());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->set_num_output(
            v0_layer_param.num_output());
      } else {
        LOG(ERROR) << "Unknown parameter num_output for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_biasterm()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->set_bias_term(
            v0_layer_param.biasterm());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->set_bias_term(
            v0_layer_param.biasterm());
      } else {
        LOG(ERROR) << "Unknown parameter biasterm for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_weight_filler()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->
            mutable_weight_filler()->CopyFrom(v0_layer_param.weight_filler());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->
            mutable_weight_filler()->CopyFrom(v0_layer_param.weight_filler());
      } else {
        LOG(ERROR) << "Unknown parameter weight_filler for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_bias_filler()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->
            mutable_bias_filler()->CopyFrom(v0_layer_param.bias_filler());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->
            mutable_bias_filler()->CopyFrom(v0_layer_param.bias_filler());
      } else {
        LOG(ERROR) << "Unknown parameter bias_filler for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_pad()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->add_pad(v0_layer_param.pad());
      } else if (type == "pool") {
        layer_param->mutable_pooling_param()->set_pad(v0_layer_param.pad());
      } else {
        LOG(ERROR) << "Unknown parameter pad for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_kernelsize()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->add_kernel_size(
            v0_layer_param.kernelsize());
      } else if (type == "pool") {
        layer_param->mutable_pooling_param()->set_kernel_size(
            v0_layer_param.kernelsize());
      } else {
        LOG(ERROR) << "Unknown parameter kernelsize for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_group()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->set_group(
            v0_layer_param.group());
      } else {
        LOG(ERROR) << "Unknown parameter group for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_stride()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->add_stride(
            v0_layer_param.stride());
      } else if (type == "pool") {
        layer_param->mutable_pooling_param()->set_stride(
            v0_layer_param.stride());
      } else {
        LOG(ERROR) << "Unknown parameter stride for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_pool()) {
      if (type == "pool") {
        V0LayerParameter_PoolMethod pool = v0_layer_param.pool();
        switch (pool) {
        case V0LayerParameter_PoolMethod_MAX:
          layer_param->mutable_pooling_param()->set_pool(
              PoolingParameter_PoolMethod_MAX);
          break;
        case V0LayerParameter_PoolMethod_AVE:
          layer_param->mutable_pooling_param()->set_pool(
              PoolingParameter_PoolMethod_AVE);
          break;
        case V0LayerParameter_PoolMethod_STOCHASTIC:
          layer_param->mutable_pooling_param()->set_pool(
              PoolingParameter_PoolMethod_STOCHASTIC);
          break;
        default:
          LOG(ERROR) << "Unknown pool method " << pool;
          is_fully_compatible = false;
        }
      } else {
        LOG(ERROR) << "Unknown parameter pool for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_dropout_ratio()) {
      if (type == "dropout") {
        layer_param->mutable_dropout_param()->set_dropout_ratio(
            v0_layer_param.dropout_ratio());
      } else {
        LOG(ERROR) << "Unknown parameter dropout_ratio for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_local_size()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_local_size(
            v0_layer_param.local_size());
      } else {
        LOG(ERROR) << "Unknown parameter local_size for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_alpha()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_alpha(v0_layer_param.alpha());
      } else {
        LOG(ERROR) << "Unknown parameter alpha for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_beta()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_beta(v0_layer_param.beta());
      } else {
        LOG(ERROR) << "Unknown parameter beta for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_k()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_k(v0_layer_param.k());
      } else {
        LOG(ERROR) << "Unknown parameter k for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_source()) {
      if (type == "data") {
        layer_param->mutable_data_param()->set_source(v0_layer_param.source());
      } else if (type == "hdf5_data") {
        layer_param->mutable_hdf5_data_param()->set_source(
            v0_layer_param.source());
      } else if (type == "images") {
        layer_param->mutable_image_data_param()->set_source(
            v0_layer_param.source());
      } else if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_source(
            v0_layer_param.source());
      } else if (type == "infogain_loss") {
        layer_param->mutable_infogain_loss_param()->set_source(
            v0_layer_param.source());
      } else {
        LOG(ERROR) << "Unknown parameter source for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_scale()) {
      layer_param->mutable_transform_param()->
          set_scale(v0_layer_param.scale());
    }
    if (v0_layer_param.has_meanfile()) {
      layer_param->mutable_transform_param()->
          set_mean_file(v0_layer_param.meanfile());
    }
    if (v0_layer_param.has_batchsize()) {
      if (type == "data") {
        layer_param->mutable_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else if (type == "hdf5_data") {
        layer_param->mutable_hdf5_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else if (type == "images") {
        layer_param->mutable_image_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else {
        LOG(ERROR) << "Unknown parameter batchsize for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_cropsize()) {
      layer_param->mutable_transform_param()->
          set_crop_size(v0_layer_param.cropsize());
    }
    if (v0_layer_param.has_mirror()) {
      layer_param->mutable_transform_param()->
          set_mirror(v0_layer_param.mirror());
    }
    if (v0_layer_param.has_rand_skip()) {
      if (type == "data") {
        layer_param->mutable_data_param()->set_rand_skip(
            v0_layer_param.rand_skip());
      } else if (type == "images") {
        layer_param->mutable_image_data_param()->set_rand_skip(
            v0_layer_param.rand_skip());
      } else {
        LOG(ERROR) << "Unknown parameter rand_skip for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_shuffle_images()) {
      if (type == "images") {
        layer_param->mutable_image_data_param()->set_shuffle(
            v0_layer_param.shuffle_images());
      } else {
        LOG(ERROR) << "Unknown parameter shuffle for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_new_height()) {
      if (type == "images") {
        layer_param->mutable_image_data_param()->set_new_height(
            v0_layer_param.new_height());
      } else {
        LOG(ERROR) << "Unknown parameter new_height for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_new_width()) {
      if (type == "images") {
        layer_param->mutable_image_data_param()->set_new_width(
            v0_layer_param.new_width());
      } else {
        LOG(ERROR) << "Unknown parameter new_width for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_concat_dim()) {
      if (type == "concat") {
        layer_param->mutable_concat_param()->set_concat_dim(
            v0_layer_param.concat_dim());
      } else {
        LOG(ERROR) << "Unknown parameter concat_dim for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_fg_threshold()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_fg_threshold(
            v0_layer_param.det_fg_threshold());
      } else {
        LOG(ERROR) << "Unknown parameter det_fg_threshold for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_bg_threshold()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_bg_threshold(
            v0_layer_param.det_bg_threshold());
      } else {
        LOG(ERROR) << "Unknown parameter det_bg_threshold for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_fg_fraction()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_fg_fraction(
            v0_layer_param.det_fg_fraction());
      } else {
        LOG(ERROR) << "Unknown parameter det_fg_fraction for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_context_pad()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_context_pad(
            v0_layer_param.det_context_pad());
      } else {
        LOG(ERROR) << "Unknown parameter det_context_pad for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_crop_mode()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_crop_mode(
            v0_layer_param.det_crop_mode());
      } else {
        LOG(ERROR) << "Unknown parameter det_crop_mode for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_hdf5_output_param()) {
      if (type == "hdf5_output") {
        layer_param->mutable_hdf5_output_param()->CopyFrom(
            v0_layer_param.hdf5_output_param());
      } else {
        LOG(ERROR) << "Unknown parameter hdf5_output_param for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
  }
  return is_fully_compatible;
}